

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenMPIRToDOT.cpp
# Opt level: O0

void __thiscall
OpenMPClause::generateDOT
          (OpenMPClause *this,ofstream *dot_file,int depth,int index,string *parent_node)

{
  bool bVar1;
  OpenMPClauseKind OVar2;
  char *pcVar3;
  OpenMPDirective *this_00;
  reference ppcVar4;
  allocator<char> local_539;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_538;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_518;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_498;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_478;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_458;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_438;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_418;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3d8;
  string local_3b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_398;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_378;
  __normal_iterator<const_char_**,_std::vector<const_char_*,_std::allocator<const_char_*>_>_>
  local_358;
  char **local_350;
  undefined1 local_348 [8];
  string expr_name;
  iterator iStack_320;
  int expr_index;
  iterator it;
  vector<const_char_*,_std::allocator<const_char_*>_> *expr;
  string local_308;
  string local_2e8;
  OpenMPDirective *local_2c8;
  OpenMPDirective *variant_directive;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_280;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_260;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_240;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_220;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_200;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e0;
  string local_1c0;
  string local_1a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_180;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_160;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_140;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_120;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  undefined1 local_c0 [8];
  string clause_label;
  allocator<char> local_89;
  undefined1 local_88 [8];
  string indent;
  string clause_kind;
  string current_line;
  string *parent_node_local;
  int index_local;
  int depth_local;
  ofstream *dot_file_local;
  OpenMPClause *this_local;
  
  std::__cxx11::string::string((string *)(clause_kind.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)(indent.field_2._M_local_buf + 8));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)local_88,(long)depth,'\t',&local_89);
  std::allocator<char>::~allocator(&local_89);
  OVar2 = getKind(this);
  switch(OVar2) {
  case OMPC_if:
    std::__cxx11::string::operator+=((string *)(indent.field_2._M_local_buf + 8),"if");
    break;
  case OMPC_num_threads:
    std::__cxx11::string::operator+=((string *)(indent.field_2._M_local_buf + 8),"num_threads");
    break;
  case OMPC_default:
    std::__cxx11::string::operator+=((string *)(indent.field_2._M_local_buf + 8),"default");
    break;
  case OMPC_private:
    std::__cxx11::string::operator+=((string *)(indent.field_2._M_local_buf + 8),"private");
    break;
  case OMPC_firstprivate:
    std::__cxx11::string::operator+=((string *)(indent.field_2._M_local_buf + 8),"firstprivate");
    break;
  case OMPC_shared:
    std::__cxx11::string::operator+=((string *)(indent.field_2._M_local_buf + 8),"shared");
    break;
  default:
    printf("The clause enum is not supported yet.\n");
    break;
  case OMPC_align:
    std::__cxx11::string::operator+=((string *)(indent.field_2._M_local_buf + 8),"align");
    break;
  case OMPC_proc_bind:
    std::__cxx11::string::operator+=((string *)(indent.field_2._M_local_buf + 8),"proc_bind");
    break;
  case OMPC_allocate:
    std::__cxx11::string::operator+=((string *)(indent.field_2._M_local_buf + 8),"allocate");
    break;
  case OMPC_num_teams:
    std::__cxx11::string::operator+=((string *)(indent.field_2._M_local_buf + 8),"num_teams");
    break;
  case OMPC_thread_limit:
    std::__cxx11::string::operator+=((string *)(indent.field_2._M_local_buf + 8),"thread_limit");
    break;
  case OMPC_collapse:
    std::__cxx11::string::operator+=((string *)(indent.field_2._M_local_buf + 8),"collapse");
    break;
  case OMPC_ordered:
    std::__cxx11::string::operator+=((string *)(indent.field_2._M_local_buf + 8),"ordered");
    break;
  case OMPC_nowait:
    std::__cxx11::string::operator+=((string *)(indent.field_2._M_local_buf + 8),"nowait");
    break;
  case OMPC_order:
    std::__cxx11::string::operator+=((string *)(indent.field_2._M_local_buf + 8),"order");
    break;
  case OMPC_safelen:
    std::__cxx11::string::operator+=((string *)(indent.field_2._M_local_buf + 8),"safelen");
    break;
  case OMPC_simdlen:
    std::__cxx11::string::operator+=((string *)(indent.field_2._M_local_buf + 8),"simdlen");
    break;
  case OMPC_aligned:
    std::__cxx11::string::operator+=((string *)(indent.field_2._M_local_buf + 8),"aligned");
    break;
  case OMPC_nontemporal:
    std::__cxx11::string::operator+=((string *)(indent.field_2._M_local_buf + 8),"nontemporal");
    break;
  case OMPC_uniform:
    std::__cxx11::string::operator+=((string *)(indent.field_2._M_local_buf + 8),"uniform");
    break;
  case OMPC_inbranch:
    std::__cxx11::string::operator+=((string *)(indent.field_2._M_local_buf + 8),"inbranch");
    break;
  case OMPC_notinbranch:
    std::__cxx11::string::operator+=((string *)(indent.field_2._M_local_buf + 8),"notinbranch");
    break;
  case OMPC_bind:
    std::__cxx11::string::operator+=((string *)(indent.field_2._M_local_buf + 8),"bind");
    break;
  case OMPC_inclusive:
    std::__cxx11::string::operator+=((string *)(indent.field_2._M_local_buf + 8),"inclusive");
    break;
  case OMPC_exclusive:
    std::__cxx11::string::operator+=((string *)(indent.field_2._M_local_buf + 8),"exclusive");
    break;
  case OMPC_copyprivate:
    std::__cxx11::string::operator+=((string *)(indent.field_2._M_local_buf + 8),"copyprivate");
    break;
  case OMPC_parallel:
    std::__cxx11::string::operator+=((string *)(indent.field_2._M_local_buf + 8),"parallel");
    break;
  case OMPC_sections:
    std::__cxx11::string::operator+=((string *)(indent.field_2._M_local_buf + 8),"sections");
    break;
  case OMPC_for:
    std::__cxx11::string::operator+=((string *)(indent.field_2._M_local_buf + 8),"for");
    break;
  case OMPC_do:
    std::__cxx11::string::operator+=((string *)(indent.field_2._M_local_buf + 8),"do");
    break;
  case OMPC_taskgroup:
    std::__cxx11::string::operator+=((string *)(indent.field_2._M_local_buf + 8),"taskgroup");
    break;
  case OMPC_initializer:
    std::__cxx11::string::operator+=((string *)(indent.field_2._M_local_buf + 8),"initializer");
    break;
  case OMPC_final:
    std::__cxx11::string::operator+=((string *)(indent.field_2._M_local_buf + 8),"final");
    break;
  case OMPC_untied:
    std::__cxx11::string::operator+=((string *)(indent.field_2._M_local_buf + 8),"untied");
    break;
  case OMPC_mergeable:
    std::__cxx11::string::operator+=((string *)(indent.field_2._M_local_buf + 8),"mergeable");
    break;
  case OMPC_priority:
    std::__cxx11::string::operator+=((string *)(indent.field_2._M_local_buf + 8),"priority");
    break;
  case OMPC_detach:
    std::__cxx11::string::operator+=((string *)(indent.field_2._M_local_buf + 8),"detach");
    break;
  case OMPC_grainsize:
    std::__cxx11::string::operator+=((string *)(indent.field_2._M_local_buf + 8),"grainsize");
    break;
  case OMPC_num_tasks:
    std::__cxx11::string::operator+=((string *)(indent.field_2._M_local_buf + 8),"num_tasks");
    break;
  case OMPC_nogroup:
    std::__cxx11::string::operator+=((string *)(indent.field_2._M_local_buf + 8),"nogroup");
    break;
  case OMPC_reverse_offload:
    std::__cxx11::string::operator+=((string *)(indent.field_2._M_local_buf + 8),"reverse_offload");
    break;
  case OMPC_unified_address:
    std::__cxx11::string::operator+=((string *)(indent.field_2._M_local_buf + 8),"unified_address");
    break;
  case OMPC_unified_shared_memory:
    std::__cxx11::string::operator+=
              ((string *)(indent.field_2._M_local_buf + 8),"unified_shared_memory");
    break;
  case OMPC_dynamic_allocators:
    std::__cxx11::string::operator+=
              ((string *)(indent.field_2._M_local_buf + 8),"dynamic_allocators");
    break;
  case OMPC_map:
    std::__cxx11::string::operator+=((string *)(indent.field_2._M_local_buf + 8),"map");
    break;
  case OMPC_use_device_ptr:
    std::__cxx11::string::operator+=((string *)(indent.field_2._M_local_buf + 8),"use_device_ptr");
    break;
  case OMPC_use_device_addr:
    std::__cxx11::string::operator+=((string *)(indent.field_2._M_local_buf + 8),"use_device_addr");
    break;
  case OMPC_is_device_ptr:
    std::__cxx11::string::operator+=((string *)(indent.field_2._M_local_buf + 8),"is_device_ptr");
    break;
  case OMPC_has_device_addr:
    std::__cxx11::string::operator+=((string *)(indent.field_2._M_local_buf + 8),"has_device_addr");
    break;
  case OMPC_uses_allocators:
    std::__cxx11::string::operator+=((string *)(indent.field_2._M_local_buf + 8),"uses_allocators");
    break;
  case OMPC_link:
    std::__cxx11::string::operator+=((string *)(indent.field_2._M_local_buf + 8),"link");
    break;
  case OMPC_device_type:
    std::__cxx11::string::operator+=((string *)(indent.field_2._M_local_buf + 8),"device_type");
    break;
  case OMPC_acq_rel:
    std::__cxx11::string::operator+=((string *)(indent.field_2._M_local_buf + 8),"acq_rel");
    break;
  case OMPC_release:
    std::__cxx11::string::operator+=((string *)(indent.field_2._M_local_buf + 8),"release");
    break;
  case OMPC_acquire:
    std::__cxx11::string::operator+=((string *)(indent.field_2._M_local_buf + 8),"acquire");
    break;
  case OMPC_read:
    std::__cxx11::string::operator+=((string *)(indent.field_2._M_local_buf + 8),"read");
    break;
  case OMPC_write:
    std::__cxx11::string::operator+=((string *)(indent.field_2._M_local_buf + 8),"write");
    break;
  case OMPC_update:
    std::__cxx11::string::operator+=((string *)(indent.field_2._M_local_buf + 8),"update");
    break;
  case OMPC_capture:
    std::__cxx11::string::operator+=((string *)(indent.field_2._M_local_buf + 8),"capture");
    break;
  case OMPC_seq_cst:
    std::__cxx11::string::operator+=((string *)(indent.field_2._M_local_buf + 8),"seq_cst");
    break;
  case OMPC_relaxed:
    std::__cxx11::string::operator+=((string *)(indent.field_2._M_local_buf + 8),"relaxed");
    break;
  case OMPC_hint:
    std::__cxx11::string::operator+=((string *)(indent.field_2._M_local_buf + 8),"hint");
    break;
  case OMPC_destroy:
    std::__cxx11::string::operator+=((string *)(indent.field_2._M_local_buf + 8),"destroy");
    break;
  case OMPC_threads:
    std::__cxx11::string::operator+=((string *)(indent.field_2._M_local_buf + 8),"threads");
    break;
  case OMPC_simd:
    std::__cxx11::string::operator+=((string *)(indent.field_2._M_local_buf + 8),"simd");
  }
  std::__cxx11::string::string((string *)local_c0,(string *)(indent.field_2._M_local_buf + 8));
  std::operator+(&local_180,parent_node,"_");
  std::operator+(&local_160,&local_180,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&indent.field_2 + 8));
  std::operator+(&local_140,&local_160,"_");
  std::__cxx11::to_string(&local_1a0,depth);
  std::operator+(&local_120,&local_140,&local_1a0);
  std::operator+(&local_100,&local_120,"_");
  std::__cxx11::to_string(&local_1c0,index);
  std::operator+(&local_e0,&local_100,&local_1c0);
  std::__cxx11::string::operator=((string *)(indent.field_2._M_local_buf + 8),(string *)&local_e0);
  std::__cxx11::string::~string((string *)&local_e0);
  std::__cxx11::string::~string((string *)&local_1c0);
  std::__cxx11::string::~string((string *)&local_100);
  std::__cxx11::string::~string((string *)&local_120);
  std::__cxx11::string::~string((string *)&local_1a0);
  std::__cxx11::string::~string((string *)&local_140);
  std::__cxx11::string::~string((string *)&local_160);
  std::__cxx11::string::~string((string *)&local_180);
  std::operator+(&local_240,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_88,
                 parent_node);
  std::operator+(&local_220,&local_240," -- ");
  std::operator+(&local_200,&local_220,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&indent.field_2 + 8));
  std::operator+(&local_1e0,&local_200,"\n");
  std::__cxx11::string::operator=
            ((string *)(clause_kind.field_2._M_local_buf + 8),(string *)&local_1e0);
  std::__cxx11::string::~string((string *)&local_1e0);
  std::__cxx11::string::~string((string *)&local_200);
  std::__cxx11::string::~string((string *)&local_220);
  std::__cxx11::string::~string((string *)&local_240);
  pcVar3 = (char *)std::__cxx11::string::c_str();
  std::operator<<((ostream *)dot_file,pcVar3);
  std::__cxx11::string::operator+=((string *)local_88,"\t");
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &variant_directive,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_88,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&indent.field_2 + 8));
  std::operator+(&local_2a0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &variant_directive," [label = \"");
  std::operator+(&local_280,&local_2a0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c0);
  std::operator+(&local_260,&local_280,"\"]\n");
  std::__cxx11::string::operator=
            ((string *)(clause_kind.field_2._M_local_buf + 8),(string *)&local_260);
  std::__cxx11::string::~string((string *)&local_260);
  std::__cxx11::string::~string((string *)&local_280);
  std::__cxx11::string::~string((string *)&local_2a0);
  std::__cxx11::string::~string((string *)&variant_directive);
  pcVar3 = (char *)std::__cxx11::string::c_str();
  std::operator<<((ostream *)dot_file,pcVar3);
  OVar2 = getKind(this);
  if ((OVar2 == OMPC_default) &&
     (this_00 = OpenMPDefaultClause::getVariantDirective((OpenMPDefaultClause *)this),
     local_2c8 = this_00, this_00 != (OpenMPDirective *)0x0)) {
    std::__cxx11::string::string((string *)&local_2e8,(string *)(indent.field_2._M_local_buf + 8));
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_308,"",(allocator<char> *)((long)&expr + 7));
    OpenMPDirective::generateDOT(this_00,dot_file,depth + 1,0,&local_2e8,&local_308);
    std::__cxx11::string::~string((string *)&local_308);
    std::allocator<char>::~allocator((allocator<char> *)((long)&expr + 7));
    std::__cxx11::string::~string((string *)&local_2e8);
  }
  it._M_current = (char **)getExpressions(this);
  if ((vector<const_char_*,_std::allocator<const_char_*>_> *)it._M_current !=
      (vector<const_char_*,_std::allocator<const_char_*>_> *)0x0) {
    __gnu_cxx::
    __normal_iterator<const_char_**,_std::vector<const_char_*,_std::allocator<const_char_*>_>_>::
    __normal_iterator(&stack0xfffffffffffffce0);
    expr_name.field_2._12_4_ = 0;
    std::__cxx11::string::string((string *)local_348);
    local_350 = (char **)std::vector<const_char_*,_std::allocator<const_char_*>_>::begin
                                   (it._M_current);
    iStack_320 = (iterator)local_350;
    while( true ) {
      local_358._M_current =
           (char **)std::vector<const_char_*,_std::allocator<const_char_*>_>::end(it._M_current);
      bVar1 = __gnu_cxx::operator!=(&stack0xfffffffffffffce0,&local_358);
      if (!bVar1) break;
      std::operator+(&local_398,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&indent.field_2 + 8),"_expr");
      std::__cxx11::to_string(&local_3b8,expr_name.field_2._12_4_);
      std::operator+(&local_378,&local_398,&local_3b8);
      std::__cxx11::string::operator=((string *)local_348,(string *)&local_378);
      std::__cxx11::string::~string((string *)&local_378);
      std::__cxx11::string::~string((string *)&local_3b8);
      std::__cxx11::string::~string((string *)&local_398);
      expr_name.field_2._12_4_ = expr_name.field_2._12_4_ + 1;
      std::operator+(&local_438,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_88,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&indent.field_2 + 8));
      std::operator+(&local_418,&local_438," -- ");
      std::operator+(&local_3f8,&local_418,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_348)
      ;
      std::operator+(&local_3d8,&local_3f8,"\n");
      std::__cxx11::string::operator=
                ((string *)(clause_kind.field_2._M_local_buf + 8),(string *)&local_3d8);
      std::__cxx11::string::~string((string *)&local_3d8);
      std::__cxx11::string::~string((string *)&local_3f8);
      std::__cxx11::string::~string((string *)&local_418);
      std::__cxx11::string::~string((string *)&local_438);
      pcVar3 = (char *)std::__cxx11::string::c_str();
      std::operator<<((ostream *)dot_file,pcVar3);
      std::operator+(&local_518,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_88,
                     "\t");
      std::operator+(&local_4f8,&local_518,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_348)
      ;
      std::operator+(&local_4d8,&local_4f8," [label = \"");
      std::operator+(&local_4b8,&local_4d8,"expr");
      std::operator+(&local_498,&local_4b8,"\\n ");
      ppcVar4 = __gnu_cxx::
                __normal_iterator<const_char_**,_std::vector<const_char_*,_std::allocator<const_char_*>_>_>
                ::operator*(&stack0xfffffffffffffce0);
      pcVar3 = *ppcVar4;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_538,pcVar3,&local_539);
      std::operator+(&local_478,&local_498,&local_538);
      std::operator+(&local_458,&local_478,"\"]\n");
      std::__cxx11::string::operator=
                ((string *)(clause_kind.field_2._M_local_buf + 8),(string *)&local_458);
      std::__cxx11::string::~string((string *)&local_458);
      std::__cxx11::string::~string((string *)&local_478);
      std::__cxx11::string::~string((string *)&local_538);
      std::allocator<char>::~allocator(&local_539);
      std::__cxx11::string::~string((string *)&local_498);
      std::__cxx11::string::~string((string *)&local_4b8);
      std::__cxx11::string::~string((string *)&local_4d8);
      std::__cxx11::string::~string((string *)&local_4f8);
      std::__cxx11::string::~string((string *)&local_518);
      pcVar3 = (char *)std::__cxx11::string::c_str();
      std::operator<<((ostream *)dot_file,pcVar3);
      __gnu_cxx::
      __normal_iterator<const_char_**,_std::vector<const_char_*,_std::allocator<const_char_*>_>_>::
      operator++(&stack0xfffffffffffffce0,0);
    }
    std::__cxx11::string::~string((string *)local_348);
  }
  std::__cxx11::string::~string((string *)local_c0);
  std::__cxx11::string::~string((string *)local_88);
  std::__cxx11::string::~string((string *)(indent.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)(clause_kind.field_2._M_local_buf + 8));
  return;
}

Assistant:

void OpenMPClause::generateDOT(std::ofstream& dot_file, int depth, int index, std::string parent_node) {

    std::string current_line;
    std::string clause_kind;
    std::string indent = std::string(depth, '\t');

    switch (this->getKind()) {
        case OMPC_private:
            clause_kind += "private";
            break;
        case OMPC_firstprivate:
            clause_kind += "firstprivate";
            break;
        case OMPC_shared:
            clause_kind += "shared";
            break;
        case OMPC_initializer:
            clause_kind += "initializer";
            break;
        case OMPC_num_threads:
            clause_kind += "num_threads";
            break;
        case OMPC_align:
            clause_kind += "align";
            break;
        case OMPC_num_teams:
            clause_kind += "num_teams";
            break;
        case OMPC_thread_limit:
            clause_kind += "thread_limit";
            break;
        case OMPC_default:
            clause_kind += "default";
            break;
        case OMPC_collapse:
            clause_kind += "collapse";
            break;
        case OMPC_ordered:
            clause_kind += "ordered";
            break;
        case OMPC_nowait:
            clause_kind += "nowait";
            break;
        case OMPC_allocate:
            clause_kind += "allocate";
            break;
        case OMPC_order:
            clause_kind += "order";
            break;
        case OMPC_safelen:
            clause_kind += "safelen";
            break;
        case OMPC_simdlen:
            clause_kind += "simdlen";
            break;
        case OMPC_aligned:
            clause_kind += "aligned";
            break;
        case OMPC_nontemporal:
            clause_kind += "nontemporal";
            break;
        case OMPC_uniform:
            clause_kind += "uniform";
            break;
        case OMPC_inbranch:
            clause_kind += "inbranch";
            break;
        case OMPC_notinbranch:
            clause_kind += "notinbranch";
            break;
        case OMPC_proc_bind:
            clause_kind += "proc_bind";
            break;
        case OMPC_bind:
            clause_kind += "bind";
            break; 
        case OMPC_inclusive:
            clause_kind += "inclusive";
            break;        
        case OMPC_exclusive:
            clause_kind += "exclusive";
            break;
        case OMPC_copyprivate:
            clause_kind += "copyprivate";
            break;
        case OMPC_parallel:
            clause_kind += "parallel";
            break;
        case OMPC_sections:
            clause_kind += "sections";
            break;
        case OMPC_for:
            clause_kind += "for";
            break;
        case OMPC_do:
            clause_kind += "do";
            break;
        case OMPC_taskgroup:
            clause_kind += "taskgroup";
            break;
        case OMPC_if:
            clause_kind += "if";
            break;
        case OMPC_reverse_offload:
            clause_kind += "reverse_offload";
            break;
        case OMPC_unified_address:
            clause_kind += "unified_address";
            break;
        case OMPC_unified_shared_memory:
            clause_kind += "unified_shared_memory";
            break;
        case OMPC_dynamic_allocators:
            clause_kind += "dynamic_allocators";
            break;
        case OMPC_final:
            clause_kind += "final";
            break;
        case OMPC_untied:
            clause_kind += "untied";
            break;
        case OMPC_mergeable:
            clause_kind += "mergeable";
            break;
        case OMPC_priority:
            clause_kind += "priority";
            break;
        case OMPC_detach:
            clause_kind += "detach";
            break;
        case OMPC_grainsize:
            clause_kind += "grainsize";
            break;
        case OMPC_num_tasks:
            clause_kind += "num_tasks";
            break;
        case OMPC_nogroup:
            clause_kind += "nogroup";
            break;
        case OMPC_map:
            clause_kind += "map";
            break;
        case OMPC_use_device_ptr:
            clause_kind += "use_device_ptr";
            break;
        case OMPC_use_device_addr:
            clause_kind += "use_device_addr";
            break;
        case OMPC_is_device_ptr:
            clause_kind += "is_device_ptr";
            break;
        case OMPC_has_device_addr:
            clause_kind += "has_device_addr";
            break;
        case OMPC_link:
            clause_kind += "link";
            break;
        case OMPC_device_type:
            clause_kind += "device_type";
            break;
        case OMPC_acq_rel:
            clause_kind += "acq_rel";
            break;
        case OMPC_release:
            clause_kind += "release";
            break;
        case OMPC_acquire:
            clause_kind += "acquire";
            break;
        case OMPC_read:
            clause_kind += "read";
            break;
        case OMPC_write:
            clause_kind += "write";
            break;
        case OMPC_update:
            clause_kind += "update";
            break;
        case OMPC_capture:
            clause_kind += "capture";
            break;
        case OMPC_seq_cst:
            clause_kind += "seq_cst";
            break;
        case OMPC_relaxed:
            clause_kind += "relaxed";
            break;
        case OMPC_hint:
            clause_kind += "hint";
            break;
        case OMPC_destroy:
            clause_kind += "destroy";
            break;
        case OMPC_threads:
            clause_kind += "threads";
            break;
        case OMPC_simd:
            clause_kind += "simd";
            break;
        case OMPC_uses_allocators:
            clause_kind += "uses_allocators";
            break;
        default:
            printf("The clause enum is not supported yet.\n");
    }
    //parent_node = parent_node.substr(0, parent_node.size()-1);
    std::string clause_label = clause_kind;
    clause_kind = parent_node + "_" + clause_kind + "_" + std::to_string(depth) + "_" + std::to_string(index);
    current_line = indent + parent_node + " -- " + clause_kind + "\n";
    dot_file << current_line.c_str();
    indent += "\t";
    current_line = indent + clause_kind + " [label = \"" + clause_label + + "\"]\n";
    dot_file << current_line.c_str();

    if (this->getKind() == OMPC_default) {
        OpenMPDirective* variant_directive = ((OpenMPDefaultClause*)this)->getVariantDirective();
        if (variant_directive != NULL) {
            variant_directive->generateDOT(dot_file, depth+1, 0, clause_kind, "");
        };
    };

    std::vector<const char*>* expr = this->getExpressions();
    if (expr != NULL) {
        std::vector<const char*>::iterator it;
        int expr_index = 0;
        std::string expr_name;
        for (it = expr->begin(); it != expr->end(); it++) {
            expr_name = clause_kind + "_expr" + std::to_string(expr_index);
            expr_index += 1;
            current_line = indent + clause_kind + " -- " + expr_name + "\n";
            dot_file << current_line.c_str();
            current_line = indent + "\t" + expr_name + " [label = \"" + "expr" + "\\n " + std::string(*it) + "\"]\n";
            dot_file << current_line.c_str();
        };
    };

}